

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# three_dim_model.cpp
# Opt level: O3

void __thiscall MODEL3D::three_dim_model::tidy_path(three_dim_model *this,Path *input_path)

{
  pointer pIVar1;
  pointer pIVar2;
  pointer __dest;
  pointer pIVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  pIVar1 = (input_path->
           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pIVar3 = (input_path->
           super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  dVar5 = 0.0;
  __dest = pIVar1 + 1;
  for (pIVar2 = __dest; pIVar2 != pIVar3; pIVar2 = pIVar2 + 1) {
    dVar6 = (double)(pIVar2->X - pIVar2[-1].X);
    dVar4 = (double)(pIVar2->Y - pIVar2[-1].Y);
    dVar5 = dVar5 + SQRT(dVar4 * dVar4 + dVar6 * dVar6);
  }
  dVar6 = (double)(pIVar3[-1].X - pIVar1->X);
  dVar4 = (double)(pIVar3[-1].Y - pIVar1->Y);
  dVar5 = ceil((SQRT(dVar4 * dVar4 + dVar6 * dVar6) + dVar5) * 0.031415926535897934);
  if (__dest != pIVar3) {
    dVar4 = (double)this->min_distance_between_points;
    if (dVar5 <= (double)this->min_distance_between_points) {
      dVar4 = dVar5;
    }
    do {
      dVar5 = (double)(__dest->X - __dest[-1].X);
      dVar6 = (double)(__dest->Y - __dest[-1].Y);
      if (SQRT(dVar6 * dVar6 + dVar5 * dVar5) < dVar4) {
        pIVar1 = __dest + 1;
        if (pIVar1 != pIVar3) {
          memmove(__dest,pIVar1,(long)pIVar3 - (long)pIVar1);
          pIVar3 = (input_path->
                   super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        }
        pIVar3 = pIVar3 + -1;
        (input_path->super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>
        )._M_impl.super__Vector_impl_data._M_finish = pIVar3;
        __dest = __dest + -1;
      }
      __dest = __dest + 1;
    } while (__dest != pIVar3);
  }
  return;
}

Assistant:

void MODEL3D::three_dim_model::tidy_path(ClipperLib::Path &input_path)
{
    //determine perimeter of path
    double path_perimeter = 0;
    auto perim_start = std::next(input_path.begin(),1);
    auto path_end = input_path.end();
    for (auto path_it = perim_start; path_it != path_end; path_it++)
    {
        ClipperLib::IntPoint prev_pt = *std::prev(path_it);
        ClipperLib::IntPoint curr_pt = *path_it;
        double delta_x_sqr = std::pow((curr_pt.X - prev_pt.X), 2);
        double delta_y_sqr = std::pow((curr_pt.Y - prev_pt.Y), 2);
        double dist = std::sqrt(delta_x_sqr+delta_y_sqr);
        path_perimeter = path_perimeter + dist;
    }
    // last to first
    double delta_x_sqr = std::pow((std::prev(input_path.end(),1)->X - input_path.begin()->X), 2);
    double delta_y_sqr = std::pow((std::prev(input_path.end(),1)->Y - input_path.begin()->Y), 2);
    double dist = std::sqrt(delta_x_sqr+delta_y_sqr);
    path_perimeter = path_perimeter + dist;
    double tolerance = std::ceil(0.01*PI*path_perimeter);//1% of perimeter tolerance
    if(tolerance>min_distance_between_points)
        tolerance = min_distance_between_points;
    //remove bunched points
    for (auto path_it = perim_start; path_it != path_end; path_it++)
    {
        ClipperLib::IntPoint prev_pt = *std::prev(path_it);
        ClipperLib::IntPoint curr_pt = *path_it;
        double delta_x_sqr = std::pow((curr_pt.X - prev_pt.X), 2);
        double delta_y_sqr = std::pow((curr_pt.Y - prev_pt.Y), 2);
        double dist = std::sqrt(delta_x_sqr+delta_y_sqr);
        if(dist<tolerance)
        {
            //delete value, then move one back because loop steps you forward again
            path_it = std::prev(input_path.erase(path_it),1);
            path_end = input_path.end();
        }
    }
}